

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

bool __thiscall
wasm::SimplifyLocals<true,_false,_true>::runMainOptimizations
          (SimplifyLocals<true,_false,_true> *this,Function *func)

{
  pointer ppBVar1;
  pointer ppIVar2;
  If *pIVar3;
  pointer ppLVar4;
  Loop *pLVar5;
  Module *in_RAX;
  Expression *pEVar6;
  Block *pBVar7;
  Expression **ppEVar8;
  iterator __begin3_1;
  pointer ppIVar9;
  pointer ppLVar10;
  iterator __begin3;
  pointer ppBVar11;
  Builder local_38;
  
  this->anotherCycle = false;
  local_38.wasm = in_RAX;
  Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  ::walk((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
          *)&(this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
         ,&func->body);
  ppBVar11 = (this->blocksToEnlarge).
             super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppBVar1 = (this->blocksToEnlarge).
            super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppBVar1 != ppBVar11) {
    for (; ppBVar11 != ppBVar1; ppBVar11 = ppBVar11 + 1) {
      pBVar7 = *ppBVar11;
      pEVar6 = (Expression *)
               MixedArena::alloc<wasm::Nop>
                         (&((this->
                            super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                            ).
                            super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            .
                            super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            .
                            super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                           .currModule)->allocator);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar7->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar6)
      ;
    }
    ppBVar11 = (this->blocksToEnlarge).
               super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->blocksToEnlarge).super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppBVar11) {
      (this->blocksToEnlarge).super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppBVar11;
    }
    this->anotherCycle = true;
  }
  ppIVar9 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppIVar2 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar9) {
    for (; ppIVar9 != ppIVar2; ppIVar9 = ppIVar9 + 1) {
      pIVar3 = *ppIVar9;
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .currModule;
      pBVar7 = Builder::blockifyWithName
                         (&local_38,pIVar3->ifTrue,(Name)ZEXT816(0),(Expression *)0x0);
      pIVar3->ifTrue = (Expression *)pBVar7;
      if (((pBVar7->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
           .usedElements == 0) ||
         (ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&(pBVar7->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              ), (*ppEVar8)->_id != NopId)) {
        pEVar6 = (Expression *)
                 MixedArena::alloc<wasm::Nop>
                           (&((this->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                             .currModule)->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar7->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar6);
      }
      if (pIVar3->ifFalse != (Expression *)0x0) {
        local_38.wasm =
             (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             .currModule;
        pBVar7 = Builder::blockifyWithName
                           (&local_38,pIVar3->ifFalse,(Name)ZEXT816(0),(Expression *)0x0);
        pIVar3->ifFalse = (Expression *)pBVar7;
        if (((pBVar7->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
             == 0) ||
           (ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                (&(pBVar7->list).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ), (*ppEVar8)->_id != NopId)) {
          pEVar6 = (Expression *)
                   MixedArena::alloc<wasm::Nop>
                             (&((this->
                                super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                                ).
                                super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                                .
                                super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                                .
                                super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                               .currModule)->allocator);
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(pBVar7->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     pEVar6);
        }
      }
    }
    ppIVar9 = (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar9) {
      (this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar9;
    }
    this->anotherCycle = true;
  }
  ppLVar10 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar4 = (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar4 != ppLVar10) {
    for (; ppLVar10 != ppLVar4; ppLVar10 = ppLVar10 + 1) {
      pLVar5 = *ppLVar10;
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           .currModule;
      pBVar7 = Builder::blockifyWithName(&local_38,pLVar5->body,(Name)ZEXT816(0),(Expression *)0x0);
      pLVar5->body = (Expression *)pBVar7;
      if (((pBVar7->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
           .usedElements == 0) ||
         (ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&(pBVar7->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              ), (*ppEVar8)->_id != NopId)) {
        pEVar6 = (Expression *)
                 MixedArena::alloc<wasm::Nop>
                           (&((this->
                              super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                              ).
                              super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_PostWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              .
                              super_Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                             .currModule)->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(pBVar7->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar6);
      }
    }
    ppLVar10 = (this->loopsToEnlarge).
               super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppLVar10) {
      (this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppLVar10;
    }
    this->anotherCycle = true;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
  ::clear(&(this->sinkables)._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>_>
  ::clear(&(this->blockBreaks)._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::clear(&(this->unoptimizableBlocks)._M_t);
  return this->anotherCycle;
}

Assistant:

bool runMainOptimizations(Function* func) {
    anotherCycle = false;
    WalkerPass<LinearExecutionWalker<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>>::
      doWalkFunction(func);
    // enlarge blocks that were marked, for the next round
    if (blocksToEnlarge.size() > 0) {
      for (auto* block : blocksToEnlarge) {
        block->list.push_back(
          this->getModule()->allocator.template alloc<Nop>());
      }
      blocksToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge ifs that were marked, for the next round
    if (ifsToEnlarge.size() > 0) {
      for (auto* iff : ifsToEnlarge) {
        auto ifTrue =
          Builder(*this->getModule()).blockifyWithName(iff->ifTrue, Name());
        iff->ifTrue = ifTrue;
        if (ifTrue->list.size() == 0 ||
            !ifTrue->list.back()->template is<Nop>()) {
          ifTrue->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
        if (iff->ifFalse) {
          auto ifFalse =
            Builder(*this->getModule()).blockifyWithName(iff->ifFalse, Name());
          iff->ifFalse = ifFalse;
          if (ifFalse->list.size() == 0 ||
              !ifFalse->list.back()->template is<Nop>()) {
            ifFalse->list.push_back(
              this->getModule()->allocator.template alloc<Nop>());
          }
        }
      }
      ifsToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge loops that were marked, for the next round
    if (loopsToEnlarge.size() > 0) {
      for (auto* loop : loopsToEnlarge) {
        auto block =
          Builder(*this->getModule()).blockifyWithName(loop->body, Name());
        loop->body = block;
        if (block->list.size() == 0 ||
            !block->list.back()->template is<Nop>()) {
          block->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
      }
      loopsToEnlarge.clear();
      anotherCycle = true;
    }
    // clean up
    sinkables.clear();
    blockBreaks.clear();
    unoptimizableBlocks.clear();
    return anotherCycle;
  }